

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O1

void TTD::NSSnapObjects::DoAddtlValueInstantiation_SnapMapInfo
               (SnapObject *snpObject,RecyclableObject *obj,InflateMap *inflator)

{
  uint *puVar1;
  Var pvVar2;
  Var pvVar3;
  uint uVar4;
  ulong uVar5;
  
  if (snpObject->SnapObjectTag != SnapMapObject) {
    TTDAbort_unrecoverable_error("Tag does not match.");
  }
  puVar1 = (uint *)snpObject->AddtlSnapObjectInfo;
  if (snpObject->SnapType->JsTypeId == TypeIds_Map) {
    if (*puVar1 != 0) {
      uVar5 = 0;
      do {
        pvVar2 = InflateMap::InflateTTDVar(inflator,*(TTDVar *)(*(long *)(puVar1 + 2) + uVar5 * 8));
        pvVar3 = InflateMap::InflateTTDVar
                           (inflator,*(TTDVar *)
                                      (*(long *)(puVar1 + 2) + (ulong)((int)uVar5 + 1) * 8));
        Js::JavascriptLibrary::AddMapElementInflate_TTD((JavascriptMap *)obj,pvVar2,pvVar3);
        uVar4 = (int)uVar5 + 2;
        uVar5 = (ulong)uVar4;
      } while (uVar4 < *puVar1);
    }
  }
  else if (*puVar1 != 0) {
    uVar5 = 0;
    do {
      pvVar2 = InflateMap::InflateTTDVar(inflator,*(TTDVar *)(*(long *)(puVar1 + 2) + uVar5 * 8));
      pvVar3 = InflateMap::InflateTTDVar
                         (inflator,*(TTDVar *)(*(long *)(puVar1 + 2) + (ulong)((int)uVar5 + 1) * 8))
      ;
      Js::JavascriptLibrary::AddWeakMapElementInflate_TTD((JavascriptWeakMap *)obj,pvVar2,pvVar3);
      uVar4 = (int)uVar5 + 2;
      uVar5 = (ulong)uVar4;
    } while (uVar4 < *puVar1);
  }
  return;
}

Assistant:

void DoAddtlValueInstantiation_SnapMapInfo(const SnapObject* snpObject, Js::RecyclableObject* obj, InflateMap* inflator)
        {
            SnapMapInfo* mapInfo = SnapObjectGetAddtlInfoAs<SnapMapInfo*, SnapObjectType::SnapMapObject>(snpObject);

            if(snpObject->SnapType->JsTypeId == Js::TypeIds_Map)
            {
                Js::JavascriptMap* mobj = (Js::JavascriptMap*)obj;
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    Js::Var key = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i]);
                    Js::Var data = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i + 1]);
                    Js::JavascriptLibrary::AddMapElementInflate_TTD(mobj, key, data);
                }
            }
            else
            {
                Js::JavascriptWeakMap* mobj = (Js::JavascriptWeakMap*)obj;
                for(uint32 i = 0; i < mapInfo->MapSize; i += 2)
                {
                    Js::Var key = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i]);
                    Js::Var data = inflator->InflateTTDVar(mapInfo->MapKeyValueArray[i + 1]);
                    Js::JavascriptLibrary::AddWeakMapElementInflate_TTD(mobj, key, data);
                }
            }
        }